

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadContextTlsEntry.cpp
# Opt level: O1

ThreadContextTLSEntry * ThreadContextTLSEntry::GetEntryForCurrentThread(void)

{
  long lVar1;
  
  lVar1 = __tls_get_addr(&PTR_0155f718);
  return *(ThreadContextTLSEntry **)(lVar1 + 0x90);
}

Assistant:

ThreadContextTLSEntry * ThreadContextTLSEntry::GetEntryForCurrentThread()
{
    ASSERT_ENTRY_INITIALIZED();
#ifdef _WIN32
    return reinterpret_cast<ThreadContextTLSEntry *>(TlsGetValue(s_tlsSlot));
#else
    return ENTRY_FOR_CURRENT_THREAD();
#endif
}